

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtShrink(word *pF,int nVars,int nVarsAll,uint Phase)

{
  int nWords;
  int local_28;
  int local_24;
  int Var;
  int k;
  int i;
  uint Phase_local;
  int nVarsAll_local;
  int nVars_local;
  word *pF_local;
  
  local_28 = 0;
  if (0x10 < nVarsAll) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x6df,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  for (Var = 0; Var < nVarsAll; Var = Var + 1) {
    local_24 = Var;
    if ((Phase & 1 << ((byte)Var & 0x1f)) != 0) {
      while (local_24 = local_24 + -1, local_28 <= local_24) {
        nWords = Abc_TtWordNum(nVarsAll);
        Abc_TtSwapAdjacent(pF,nWords,local_24);
      }
      local_28 = local_28 + 1;
    }
  }
  if (local_28 != nVars) {
    __assert_fail("Var == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  return;
}

Assistant:

static inline void Abc_TtShrink( word * pF, int nVars, int nVarsAll, unsigned Phase )
{
    int i, k, Var = 0;
    assert( nVarsAll <= 16 );
    for ( i = 0; i < nVarsAll; i++ )
        if ( Phase & (1 << i) )
        {
            for ( k = i-1; k >= Var; k-- )
                Abc_TtSwapAdjacent( pF, Abc_TtWordNum(nVarsAll), k );
            Var++;
        }
    assert( Var == nVars );
}